

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
anon_unknown.dwarf_20069f2::ParseKeyPathNum
          (anon_unknown_dwarf_20069f2 *this,Span<const_char> elem,bool *apostrophe,string *error)

{
  anon_unknown_dwarf_20069f2 aVar1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar4;
  string *__return_storage_ptr__;
  uint uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  string_view str;
  uint32_t p;
  uint local_74;
  string local_70;
  string local_50;
  long local_30;
  
  pcVar6 = elem.m_data;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    aVar1 = (this + -1)[(long)pcVar6];
    if ((aVar1 == (anon_unknown_dwarf_20069f2)0x68) ||
       (uVar5 = 0, aVar1 == (anon_unknown_dwarf_20069f2)0x27)) {
      pcVar6 = pcVar6 + -1;
      *(bool *)elem.m_size = aVar1 == (anon_unknown_dwarf_20069f2)0x27;
      uVar5 = 0x80000000;
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)apostrophe;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,this,pcVar6 + (long)this);
  str._M_str = local_50._M_dataplus._M_p;
  str._M_len = local_50._M_string_length;
  bVar2 = ParseUInt32(str,&local_74);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    if (-1 < (int)local_74) {
      uVar4 = (ulong)(local_74 | uVar5);
      uVar3 = 0x100000000;
      goto LAB_005cc747;
    }
    __return_storage_ptr__ = &local_50;
    tinyformat::format<unsigned_int>
              (__return_storage_ptr__,"Key path value %u is out of range",&local_74);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)apostrophe,
               __return_storage_ptr__);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,this,pcVar6 + (long)this);
    tinyformat::format<std::__cxx11::string>
              (&local_50,(tinyformat *)"Key path value \'%s\' is not a valid uint32",
               (char *)&local_70,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)apostrophe,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    __return_storage_ptr__ = &local_70;
  }
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  uVar4 = 0;
  uVar3 = 0;
LAB_005cc747:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (optional<unsigned_int>)(uVar3 | uVar4);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint32_t> ParseKeyPathNum(Span<const char> elem, bool& apostrophe, std::string& error)
{
    bool hardened = false;
    if (elem.size() > 0) {
        const char last = elem[elem.size() - 1];
        if (last == '\'' || last == 'h') {
            elem = elem.first(elem.size() - 1);
            hardened = true;
            apostrophe = last == '\'';
        }
    }
    uint32_t p;
    if (!ParseUInt32(std::string(elem.begin(), elem.end()), &p)) {
        error = strprintf("Key path value '%s' is not a valid uint32", std::string(elem.begin(), elem.end()));
        return std::nullopt;
    } else if (p > 0x7FFFFFFFUL) {
        error = strprintf("Key path value %u is out of range", p);
        return std::nullopt;
    }

    return std::make_optional<uint32_t>(p | (((uint32_t)hardened) << 31));
}